

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

rnnenum * rnn_findenum(rnndb *db,char *name)

{
  int iVar1;
  rnnenum **pprVar2;
  rnnenum *prVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = db->enumsnum;
  if (0 < (long)iVar1) {
    pprVar2 = db->enums;
    lVar5 = 0;
    do {
      prVar3 = pprVar2[lVar5];
      iVar4 = strcmp(prVar3->name,name);
      if (iVar4 == 0) {
        return prVar3;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return (rnnenum *)0x0;
}

Assistant:

struct rnnenum *rnn_findenum (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		if (!strcmp(db->enums[i]->name, name))
			return db->enums[i];
	return 0;
}